

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_paged_audio_buffer_seek_to_pcm_frame
                    (ma_paged_audio_buffer *pPagedAudioBuffer,ma_uint64 frameIndex)

{
  ma_paged_audio_buffer_page *pmVar1;
  ulong uVar2;
  ulong in_RSI;
  long in_RDI;
  ma_uint64 pageRangeEnd;
  ma_uint64 pageRangeBeg;
  ma_uint64 runningCursor;
  ma_paged_audio_buffer_page *pPage;
  ulong local_70;
  ma_paged_audio_buffer_page *local_68;
  ma_result local_4c;
  
  if (in_RDI == 0) {
    local_4c = MA_INVALID_ARGS;
  }
  else if (in_RSI == *(ulong *)(in_RDI + 0x60)) {
    local_4c = MA_SUCCESS;
  }
  else {
    if (in_RSI < *(ulong *)(in_RDI + 0x60)) {
      pmVar1 = ma_paged_audio_buffer_data_get_head(*(ma_paged_audio_buffer_data **)(in_RDI + 0x48));
      *(ma_paged_audio_buffer_page **)(in_RDI + 0x50) = pmVar1;
      *(undefined8 *)(in_RDI + 0x60) = 0;
      *(undefined8 *)(in_RDI + 0x58) = 0;
    }
    if (*(ulong *)(in_RDI + 0x60) < in_RSI) {
      local_70 = 0;
      pmVar1 = ma_paged_audio_buffer_data_get_head(*(ma_paged_audio_buffer_data **)(in_RDI + 0x48));
      for (local_68 = pmVar1->pNext; local_68 != (ma_paged_audio_buffer_page *)0x0;
          local_68 = local_68->pNext) {
        uVar2 = local_70 + local_68->sizeInFrames;
        if ((local_70 <= in_RSI) &&
           ((in_RSI < uVar2 ||
            ((in_RSI == uVar2 &&
             (pmVar1 = ma_paged_audio_buffer_data_get_tail
                                 (*(ma_paged_audio_buffer_data **)(in_RDI + 0x48)),
             local_68 == pmVar1->pNext)))))) {
          *(ma_paged_audio_buffer_page **)(in_RDI + 0x50) = local_68;
          *(ulong *)(in_RDI + 0x60) = in_RSI;
          *(ulong *)(in_RDI + 0x58) = in_RSI - local_70;
          return MA_SUCCESS;
        }
        local_70 = uVar2;
      }
      local_4c = MA_BAD_SEEK;
    }
    else {
      local_4c = MA_SUCCESS;
    }
  }
  return local_4c;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_seek_to_pcm_frame(ma_paged_audio_buffer* pPagedAudioBuffer, ma_uint64 frameIndex)
{
    if (pPagedAudioBuffer == NULL) {
        return MA_INVALID_ARGS;
    }

    if (frameIndex == pPagedAudioBuffer->absoluteCursor) {
        return MA_SUCCESS;  /* Nothing to do. */
    }

    if (frameIndex < pPagedAudioBuffer->absoluteCursor) {
        /* Moving backwards. Need to move the cursor back to the start, and then move forward. */
        pPagedAudioBuffer->pCurrent       = ma_paged_audio_buffer_data_get_head(pPagedAudioBuffer->pData);
        pPagedAudioBuffer->absoluteCursor = 0;
        pPagedAudioBuffer->relativeCursor = 0;

        /* Fall through to the forward seeking section below. */
    }

    if (frameIndex > pPagedAudioBuffer->absoluteCursor) {
        /* Moving forward. */
        ma_paged_audio_buffer_page* pPage;
        ma_uint64 runningCursor = 0;

        for (pPage = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&ma_paged_audio_buffer_data_get_head(pPagedAudioBuffer->pData)->pNext); pPage != NULL; pPage = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pPage->pNext)) {
            ma_uint64 pageRangeBeg = runningCursor;
            ma_uint64 pageRangeEnd = pageRangeBeg + pPage->sizeInFrames;

            if (frameIndex >= pageRangeBeg) {
                if (frameIndex < pageRangeEnd || (frameIndex == pageRangeEnd && pPage == (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(ma_paged_audio_buffer_data_get_tail(pPagedAudioBuffer->pData)))) {  /* A small edge case - allow seeking to the very end of the buffer. */
                    /* We found the page. */
                    pPagedAudioBuffer->pCurrent       = pPage;
                    pPagedAudioBuffer->absoluteCursor = frameIndex;
                    pPagedAudioBuffer->relativeCursor = frameIndex - pageRangeBeg;
                    return MA_SUCCESS;
                }
            }

            runningCursor = pageRangeEnd;
        }

        /* Getting here means we tried seeking too far forward. Don't change any state. */
        return MA_BAD_SEEK;
    }

    return MA_SUCCESS;
}